

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

bool __thiscall CNetAddr::IsLocal(CNetAddr *this)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [11];
  undefined1 auVar5 [12];
  undefined1 auVar6 [13];
  undefined1 auVar7 [14];
  bool bVar8;
  uchar *puVar9;
  value_type_conflict *pvVar10;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *in_RDI;
  long in_FS_OFFSET;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  byte bVar24;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  size_type pos;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *this_00;
  bool local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar8 = IsIPv4((CNetAddr *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  pos = (size_type)((ulong)in_RDI >> 0x20);
  if ((bVar8) &&
     ((puVar9 = prevector<16U,_unsigned_char,_unsigned_int,_int>::operator[](this_00,pos),
      *puVar9 == '\x7f' ||
      (puVar9 = prevector<16U,_unsigned_char,_unsigned_int,_int>::operator[](this_00,pos),
      *puVar9 == '\0')))) {
    local_9 = true;
  }
  else {
    bVar8 = IsIPv6((CNetAddr *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
    if (bVar8) {
      pvVar10 = prevector<16U,_unsigned_char,_unsigned_int,_int>::data
                          ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                           CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
      cVar11 = -(pvVar10[2] == '\0');
      cVar12 = -(pvVar10[3] == '\0');
      cVar13 = -(pvVar10[4] == '\0');
      cVar14 = -(pvVar10[5] == '\0');
      cVar15 = -(pvVar10[6] == '\0');
      cVar16 = -(pvVar10[7] == '\0');
      cVar17 = -(pvVar10[8] == '\0');
      cVar18 = -(pvVar10[9] == '\0');
      cVar19 = -(pvVar10[10] == '\0');
      cVar20 = -(pvVar10[0xb] == '\0');
      cVar21 = -(pvVar10[0xc] == '\0');
      cVar22 = -(pvVar10[0xd] == '\0');
      cVar23 = -(pvVar10[0xe] == '\0');
      bVar24 = -(pvVar10[0xf] == '\x01');
      auVar2[1] = -(pvVar10[1] == '\0');
      auVar2[0] = -(*pvVar10 == '\0');
      auVar2[2] = cVar11;
      auVar2[3] = cVar12;
      auVar2[4] = cVar13;
      auVar2[5] = cVar14;
      auVar2[6] = cVar15;
      auVar2[7] = cVar16;
      auVar2[8] = cVar17;
      auVar2[9] = cVar18;
      auVar2[10] = cVar19;
      auVar2[0xb] = cVar20;
      auVar2[0xc] = cVar21;
      auVar2[0xd] = cVar22;
      auVar2[0xe] = cVar23;
      auVar2[0xf] = bVar24;
      auVar3[1] = -(pvVar10[1] == '\0');
      auVar3[0] = -(*pvVar10 == '\0');
      auVar3[2] = cVar11;
      auVar3[3] = cVar12;
      auVar3[4] = cVar13;
      auVar3[5] = cVar14;
      auVar3[6] = cVar15;
      auVar3[7] = cVar16;
      auVar3[8] = cVar17;
      auVar3[9] = cVar18;
      auVar3[10] = cVar19;
      auVar3[0xb] = cVar20;
      auVar3[0xc] = cVar21;
      auVar3[0xd] = cVar22;
      auVar3[0xe] = cVar23;
      auVar3[0xf] = bVar24;
      auVar7[1] = cVar12;
      auVar7[0] = cVar11;
      auVar7[2] = cVar13;
      auVar7[3] = cVar14;
      auVar7[4] = cVar15;
      auVar7[5] = cVar16;
      auVar7[6] = cVar17;
      auVar7[7] = cVar18;
      auVar7[8] = cVar19;
      auVar7[9] = cVar20;
      auVar7[10] = cVar21;
      auVar7[0xb] = cVar22;
      auVar7[0xc] = cVar23;
      auVar7[0xd] = bVar24;
      auVar6[1] = cVar13;
      auVar6[0] = cVar12;
      auVar6[2] = cVar14;
      auVar6[3] = cVar15;
      auVar6[4] = cVar16;
      auVar6[5] = cVar17;
      auVar6[6] = cVar18;
      auVar6[7] = cVar19;
      auVar6[8] = cVar20;
      auVar6[9] = cVar21;
      auVar6[10] = cVar22;
      auVar6[0xb] = cVar23;
      auVar6[0xc] = bVar24;
      auVar5[1] = cVar14;
      auVar5[0] = cVar13;
      auVar5[2] = cVar15;
      auVar5[3] = cVar16;
      auVar5[4] = cVar17;
      auVar5[5] = cVar18;
      auVar5[6] = cVar19;
      auVar5[7] = cVar20;
      auVar5[8] = cVar21;
      auVar5[9] = cVar22;
      auVar5[10] = cVar23;
      auVar5[0xb] = bVar24;
      auVar4[1] = cVar15;
      auVar4[0] = cVar14;
      auVar4[2] = cVar16;
      auVar4[3] = cVar17;
      auVar4[4] = cVar18;
      auVar4[5] = cVar19;
      auVar4[6] = cVar20;
      auVar4[7] = cVar21;
      auVar4[8] = cVar22;
      auVar4[9] = cVar23;
      auVar4[10] = bVar24;
      if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB141(auVar7 >> 7,0) & 1) << 2 |
                   (ushort)(SUB131(auVar6 >> 7,0) & 1) << 3 |
                   (ushort)(SUB121(auVar5 >> 7,0) & 1) << 4 |
                   (ushort)(SUB111(auVar4 >> 7,0) & 1) << 5 |
                   (ushort)((byte)(CONCAT19(bVar24,CONCAT18(cVar23,CONCAT17(cVar22,CONCAT16(cVar21,
                                                  CONCAT15(cVar20,CONCAT14(cVar19,CONCAT13(cVar18,
                                                  CONCAT12(cVar17,CONCAT11(cVar16,cVar15))))))))) >>
                                  7) & 1) << 6 |
                   (ushort)((byte)(CONCAT18(bVar24,CONCAT17(cVar23,CONCAT16(cVar22,CONCAT15(cVar21,
                                                  CONCAT14(cVar20,CONCAT13(cVar19,CONCAT12(cVar18,
                                                  CONCAT11(cVar17,cVar16)))))))) >> 7) & 1) << 7 |
                  (ushort)(bVar24 >> 7) << 0xf) == 0xffff) {
        local_9 = true;
        goto LAB_00dff967;
      }
    }
    local_9 = false;
  }
LAB_00dff967:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_9;
}

Assistant:

bool CNetAddr::IsLocal() const
{
    // IPv4 loopback (127.0.0.0/8 or 0.0.0.0/8)
    if (IsIPv4() && (m_addr[0] == 127 || m_addr[0] == 0)) {
        return true;
    }

    // IPv6 loopback (::1/128)
    static const unsigned char pchLocal[16] = {0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1};
    if (IsIPv6() && memcmp(m_addr.data(), pchLocal, sizeof(pchLocal)) == 0) {
        return true;
    }

    return false;
}